

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objetosAcertaveis.h
# Opt level: O0

bool __thiscall
objetosAcertaveis::acerto(objetosAcertaveis *this,raio *raio,double tMin,double tMax,acerto *acerto)

{
  bool bVar1;
  uint uVar2;
  __shared_ptr_access<objetoAcertavel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  shared_ptr<objetoAcertavel> *objeto;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
  *__range1;
  double acertoMaisProximo;
  undefined1 local_70 [7];
  bool acertouAlgo;
  acerto acertoTemporario;
  acerto *acerto_local;
  double tMax_local;
  double tMin_local;
  raio *raio_local;
  objetosAcertaveis *this_local;
  
  acertoTemporario._56_8_ = acerto;
  ::acerto::acerto((acerto *)local_70);
  acertoMaisProximo._7_1_ = false;
  __end1 = std::
           vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
           ::begin(&this->objetos);
  objeto = (shared_ptr<objetoAcertavel> *)
           std::
           vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
           ::end(&this->objetos);
  __range1 = (vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
              *)tMax;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<objetoAcertavel>_*,_std::vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>_>
                                     *)&objeto), bVar1) {
    this_00 = (__shared_ptr_access<objetoAcertavel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<objetoAcertavel>_*,_std::vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>_>
              ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<objetoAcertavel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    uVar2 = (**peVar3->_vptr_objetoAcertavel)(tMin,__range1,peVar3,raio,local_70);
    if ((uVar2 & 1) != 0) {
      acertoMaisProximo._7_1_ = true;
      __range1 = (vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
                  *)acertoTemporario.normal.e[2];
      memcpy((void *)acertoTemporario._56_8_,local_70,0x39);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<objetoAcertavel>_*,_std::vector<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>_>
    ::operator++(&__end1);
  }
  return acertoMaisProximo._7_1_;
}

Assistant:

bool objetosAcertaveis::acerto(const raio &raio, double tMin, double tMax, struct acerto &acerto) const {
    struct acerto acertoTemporario;
    bool acertouAlgo = false;
    double acertoMaisProximo = tMax;

    for (const auto &objeto : objetos) {
        if (objeto->acerto(raio, tMin, acertoMaisProximo, acertoTemporario)) {
            acertouAlgo = true;
            acertoMaisProximo = acertoTemporario.t;
            acerto = acertoTemporario;
        }
    }

    return acertouAlgo;
}